

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_cvttps2pi_x86_64(CPUX86State *env,MMXReg *d,ZMMReg *s)

{
  uint32_t uVar1;
  
  uVar1 = x86_float32_to_int32_round_to_zero(s->_s_ZMMReg[0],&env->sse_status);
  d->_l_MMXReg[0] = uVar1;
  uVar1 = x86_float32_to_int32_round_to_zero(s->_s_ZMMReg[1],&env->sse_status);
  d->_l_MMXReg[1] = uVar1;
  return;
}

Assistant:

void helper_cvttps2pi(CPUX86State *env, MMXReg *d, ZMMReg *s)
{
    d->MMX_L(0) = x86_float32_to_int32_round_to_zero(s->ZMM_S(0), &env->sse_status);
    d->MMX_L(1) = x86_float32_to_int32_round_to_zero(s->ZMM_S(1), &env->sse_status);
}